

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QByteArray * qt_convert_to_latin1(QByteArray *__return_storage_ptr__,QStringView string)

{
  QByteArray *in_RAX;
  QByteArray *extraout_RAX;
  char *dst;
  
  if (string.m_data != (char16_t *)0x0) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(__return_storage_ptr__,string.m_size,Uninitialized);
    dst = (__return_storage_ptr__->d).ptr;
    if ((uchar *)dst == (uchar *)0x0) {
      dst = &QByteArray::_empty;
    }
    qt_to_latin1((uchar *)dst,string.m_data,string.m_size);
    return extraout_RAX;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return in_RAX;
}

Assistant:

Q_NEVER_INLINE
static QByteArray qt_convert_to_latin1(QStringView string)
{
    if (Q_UNLIKELY(string.isNull()))
        return QByteArray();

    QByteArray ba(string.size(), Qt::Uninitialized);

    // since we own the only copy, we're going to const_cast the constData;
    // that avoids an unnecessary call to detach() and expansion code that will never get used
    qt_to_latin1(reinterpret_cast<uchar *>(const_cast<char *>(ba.constData())),
                 string.utf16(), string.size());
    return ba;
}